

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  byte bVar1;
  ushort uVar2;
  int p2;
  Parse *pParse;
  SrcList *pSVar3;
  Vdbe *p;
  WhereRightJoin *pWVar4;
  WhereLoop *pWVar5;
  ulong uVar6;
  WhereTerm *pWVar7;
  Table *pTab;
  Index *pIVar8;
  int iVar9;
  int iVar10;
  Expr *pEVar11;
  Expr *pLeft;
  WhereInfo *pWInfo_00;
  uint uVar12;
  int iVar13;
  Index **ppIVar14;
  Op *pOVar15;
  SrcItem *pSVar16;
  SrcItem *pSVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  SrcList sFrom;
  
  bVar21 = 0;
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  p = pParse->pVdbe;
  pWVar4 = pLevel->pRJ;
  pWVar5 = pLevel->pWLoop;
  bVar1 = pLevel->iFrom;
  uVar18 = 0;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s");
  if (0 < iLevel) {
    lVar19 = 0;
    uVar18 = 0;
    do {
      uVar18 = uVar18 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + lVar19) + 8);
      sqlite3VdbeAddOp3(p,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + lVar19),0,0);
      iVar10 = *(int *)((long)&pWInfo->a[0].iIdxCur + lVar19);
      if (iVar10 != 0) {
        sqlite3VdbeAddOp3(p,0x88,iVar10,0,0);
      }
      lVar19 = lVar19 + 0x70;
    } while ((ulong)(uint)iLevel * 0x70 - lVar19 != 0);
  }
  if (((pSVar3->a[bVar1].fg.jointype & 0x40) == 0) && (iVar10 = (pWInfo->sWC).nTerm, 0 < iVar10)) {
    uVar6 = pWVar5->maskSelf;
    lVar20 = 0;
    lVar19 = 0;
    pLeft = (Expr *)0x0;
    do {
      pWVar7 = (pWInfo->sWC).a;
      if (((*(ushort *)((long)&pWVar7->wtFlags + lVar20) & 0x8002) != 0) &&
         (*(short *)((long)&pWVar7->eOperator + lVar20) != 0x2000)) break;
      if (((*(ulong *)((long)&pWVar7->prereqAll + lVar20) & ~(uVar18 | uVar6)) == 0) &&
         (pEVar11 = *(Expr **)((long)&pWVar7->pExpr + lVar20), (pEVar11->flags & 3) == 0)) {
        pEVar11 = exprDup(pParse->db,pEVar11,0,(u8 **)0x0);
        pLeft = sqlite3ExprAnd(pParse,pLeft,pEVar11);
        iVar10 = (pWInfo->sWC).nTerm;
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x38;
    } while (lVar19 < iVar10);
  }
  else {
    pLeft = (Expr *)0x0;
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  pSVar16 = pSVar3->a + bVar1;
  pSVar17 = sFrom.a;
  for (lVar19 = 0xd; lVar19 != 0; lVar19 = lVar19 + -1) {
    pSVar17->pSchema = pSVar16->pSchema;
    pSVar16 = (SrcItem *)((long)pSVar16 + ((ulong)bVar21 * -2 + 1) * 8);
    pSVar17 = (SrcItem *)((long)pSVar17 + (ulong)bVar21 * -0x10 + 8);
  }
  sFrom.a[0].fg.jointype = '\0';
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&sFrom,pLeft,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0,
                                0x1000,0);
  if (pWInfo_00 == (WhereInfo *)0x0) goto LAB_0018cec2;
  iVar9 = pLevel->iTabCur;
  iVar13 = pParse->nMem;
  iVar10 = iVar13 + 1;
  pParse->nMem = iVar10;
  p2 = pWInfo_00->iContinue;
  pTab = pSVar3->a[bVar1].pTab;
  if ((pTab->tabFlags & 0x80) == 0) {
    sqlite3VdbeAddOp3(p,0x87,iVar9,iVar10,0);
    uVar12 = 1;
  }
  else {
    ppIVar14 = &pTab->pIndex;
    do {
      pIVar8 = *ppIVar14;
      ppIVar14 = &pIVar8->pNext;
    } while ((*(ushort *)&pIVar8->field_0x63 & 3) != 2);
    uVar2 = pIVar8->nKeyCol;
    pParse->nMem = iVar13 + (uint)uVar2;
    uVar12 = (uint)uVar2;
    if (uVar2 == 0) {
      uVar12 = 0;
    }
    else {
      uVar18 = 0;
      do {
        sqlite3ExprCodeGetColumnOfTable
                  (p,pTab,iVar9,(int)pIVar8->aiColumn[uVar18],(int)uVar18 + iVar10);
        uVar18 = uVar18 + 1;
      } while (uVar12 != uVar18);
    }
  }
  iVar9 = sqlite3VdbeAddOp3(p,0x3f,pWVar4->regBloom,0,iVar10);
  if (p->db->mallocFailed == '\0') {
    pOVar15 = p->aOp;
    pOVar15[iVar9].p4type = -3;
    pOVar15[iVar9].p4.i = uVar12;
  }
  iVar10 = sqlite3VdbeAddOp3(p,0x1c,pWVar4->iMatch,p2,iVar10);
  if (p->db->mallocFailed == '\0') {
    pOVar15 = p->aOp;
    pOVar15[iVar10].p4type = -3;
    pOVar15[iVar10].p4.i = uVar12;
    iVar10 = p->nOp;
    if (p->db->mallocFailed != '\0') goto LAB_0018ce96;
    iVar13 = iVar10 + -1;
    if (-1 < iVar9) {
      iVar13 = iVar9;
    }
    pOVar15 = p->aOp + iVar13;
  }
  else {
    iVar10 = p->nOp;
LAB_0018ce96:
    pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar15->p2 = iVar10;
  sqlite3VdbeAddOp3(p,9,pWVar4->regReturn,pWVar4->addrSubrtn,0);
  sqlite3WhereEnd(pWInfo_00);
LAB_0018cec2:
  if (pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,pLeft);
  }
  sqlite3VdbeExplainPop(pParse);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}